

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.h
# Opt level: O2

void __thiscall crnlib::mipmapped_texture::qdxt_state::qdxt_state(qdxt_state *this,task_pool *tp)

{
  this->m_fmt = PIXEL_FMT_INVALID;
  qdxt1::qdxt1(&this->m_qdxt1,tp);
  qdxt5::qdxt5(&this->m_qdxt5a,tp);
  qdxt5::qdxt5(&this->m_qdxt5b,tp);
  (this->m_pixel_blocks).m_p = (dxt_pixel_block *)0x0;
  (this->m_pixel_blocks).m_size = 0;
  (this->m_pixel_blocks).m_capacity = 0;
  qdxt1_params::clear(&this->m_qdxt1_params);
  qdxt5_params::clear(this->m_qdxt5_params);
  qdxt5_params::clear(this->m_qdxt5_params + 1);
  return;
}

Assistant:

qdxt_state(task_pool& tp)
        : m_fmt(PIXEL_FMT_INVALID), m_qdxt1(tp), m_qdxt5a(tp), m_qdxt5b(tp) {
    }